

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O3

void bashHashStart(void *state,size_t l)

{
  memSet(state,'\0',0xc0);
  *(char *)((long)state + 0xb8) = (char)(l >> 2);
  *(size_t *)((long)state + 0x180) = 0xc0 - (l >> 1);
  *(undefined8 *)((long)state + 0x188) = 0;
  return;
}

Assistant:

void bashHashStart(void* state, size_t l)
{
	bash_hash_st* st = (bash_hash_st*)state;
	ASSERT(l > 0 && l % 16 == 0 && l <= 256);
	ASSERT(memIsValid(st, bashHash_keep()));
	// s <- 0^{1536 - 64} || <l / 4>_{64}
	memSetZero(st->s, sizeof(st->s));
	st->s[192 - 8] = (octet)(l / 4);
	// длина блока
	st->buf_len = 192 - l / 2;
	// нет накопленнных октетов
	st->pos = 0;
}